

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O2

void inclinenumber(LexState *ls)

{
  size_t sVar1;
  int iVar2;
  ZIO *pZVar3;
  byte *pbVar4;
  uint uVar5;
  uint uVar6;
  
  uVar6 = ls->current;
  pZVar3 = ls->z;
  sVar1 = pZVar3->n;
  pZVar3->n = pZVar3->n - 1;
  if (sVar1 == 0) {
    uVar5 = luaZ_fill(pZVar3);
  }
  else {
    pbVar4 = (byte *)pZVar3->p;
    pZVar3->p = (char *)(pbVar4 + 1);
    uVar5 = (uint)*pbVar4;
  }
  ls->current = uVar5;
  if (((uVar5 == 0xd) || (uVar5 == 10)) && (uVar5 != uVar6)) {
    pZVar3 = ls->z;
    sVar1 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar1 == 0) {
      uVar6 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar6 = (uint)*pbVar4;
    }
    ls->current = uVar6;
  }
  iVar2 = ls->linenumber;
  ls->linenumber = iVar2 + 1;
  if (iVar2 < 0x7ffffffc) {
    return;
  }
  lexerror(ls,"chunk has too many lines",0);
}

Assistant:

static void inclinenumber (LexState *ls) {
  int old = ls->current;
  lua_assert(currIsNewline(ls));
  next(ls);  /* skip `\n' or `\r' */
  if (currIsNewline(ls) && ls->current != old)
    next(ls);  /* skip `\n\r' or `\r\n' */
  if (++ls->linenumber >= MAX_INT)
    lexerror(ls, "chunk has too many lines", 0);
}